

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_parser_parseByteArrayExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sourcePosition;
  char *errorMessage;
  size_t endIndex;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 0x1e) {
    startIndex = state->tokenPosition;
    state->tokenPosition = startIndex + 1;
    sVar2 = sysbvm_parser_parseExpressionListUntil(context,state,SYSBVM_TOKEN_KIND_RBRACKET);
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 == 0xc) {
      endIndex = state->tokenPosition + 1;
      state->tokenPosition = endIndex;
      sourcePosition =
           sysbvm_parser_makeSourcePositionForTokenRange
                     (context,state->sourceCode,state->tokenSequence,startIndex,endIndex);
      sVar2 = sysbvm_astMakeByteArrayNode_create(context,sourcePosition,sVar2);
      return sVar2;
    }
    sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    errorMessage = "Expected a right bracket.";
  }
  else {
    sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    errorMessage = "Expected a byte array start.";
  }
  sVar2 = sysbvm_astErrorNode_createWithCString(context,sVar2,errorMessage);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseByteArrayExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_BYTE_ARRAY_START)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a byte array start.");
    
    size_t startPosition = state->tokenPosition;
    ++state->tokenPosition;

    sysbvm_tuple_t elements = sysbvm_parser_parseExpressionListUntil(context, state, SYSBVM_TOKEN_KIND_RBRACKET);

    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_RBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a right bracket.");
    
    ++state->tokenPosition;
    size_t endPosition = state->tokenPosition;

    return sysbvm_astMakeByteArrayNode_create(context, sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition), elements);
}